

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inifile.cpp
# Opt level: O0

bool __thiscall utils::IniFile::readFile(IniFile *this,string *filename)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  DebugStream *pDVar4;
  istream *piVar5;
  long lVar6;
  mapped_type *this_00;
  mapped_type *this_01;
  string local_4d0 [32];
  string local_4b0 [8];
  string value;
  allocator local_489;
  string local_488 [39];
  allocator local_461;
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [8];
  string name;
  allocator local_3d9;
  string local_3d8 [39];
  string local_3b1;
  long local_3b0;
  size_t nameEnd;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  string local_339;
  long local_338;
  size_t end;
  string local_310 [32];
  long local_2f0;
  size_t commentStart;
  size_t linenum;
  string group;
  string local_2c0 [8];
  string line;
  string local_298 [39];
  allocator local_271;
  string local_270 [35];
  string local_24d [13];
  undefined1 local_240 [8];
  wordexp_t exp_res;
  ifstream file;
  string *filename_local;
  IniFile *this_local;
  
  std::ifstream::ifstream(&exp_res.we_offs);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  wordexp(pcVar3,(wordexp_t *)local_240,0);
  std::ifstream::open((char *)&exp_res.we_offs,(_Ios_Openmode)*(undefined8 *)exp_res.we_wordc);
  wordfree((wordexp_t *)local_240);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_270,"inifile",&local_271);
    debug(local_24d);
    pDVar4 = DebugStream::operator<<((DebugStream *)local_24d,"unable to open file");
    std::__cxx11::string::string(local_298,(string *)filename);
    DebugStream::operator<<(pDVar4,(string *)local_298);
    std::__cxx11::string::~string(local_298);
    DebugStream::~DebugStream((DebugStream *)local_24d);
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    this_local._7_1_ = true;
  }
  else {
    std::__cxx11::string::string(local_2c0);
    std::__cxx11::string::string((string *)&linenum);
    commentStart = 0;
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&exp_res.we_offs,local_2c0);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if (!bVar2) break;
      commentStart = commentStart + 1;
      local_2f0 = std::__cxx11::string::find((char *)local_2c0,0x140700);
      if (local_2f0 != -1) {
        std::__cxx11::string::substr((ulong)&end,(ulong)local_2c0);
        trim(local_310);
        std::__cxx11::string::operator=(local_2c0,(string *)local_310);
        std::__cxx11::string::~string((string *)local_310);
        std::__cxx11::string::~string((string *)&end);
      }
      lVar6 = std::__cxx11::string::length();
      if ((lVar6 != 0) && (pcVar3 = (char *)std::__cxx11::string::front(), *pcVar3 != '#')) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_2c0);
        if (*pcVar3 == '[') {
          local_338 = std::__cxx11::string::find((char)local_2c0,0x5d);
          if (local_338 == -1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_360,"inifile",&local_361);
            debug(&local_339);
            pDVar4 = DebugStream::operator<<
                               ((DebugStream *)&local_339,"invalid file, unclosed group at line ");
            DebugStream::operator<<(pDVar4,commentStart);
            DebugStream::~DebugStream((DebugStream *)&local_339);
            std::__cxx11::string::~string(local_360);
            std::allocator<char>::~allocator((allocator<char> *)&local_361);
            this_local._7_1_ = false;
            goto LAB_0013b39d;
          }
          std::__cxx11::string::substr((ulong)&nameEnd,(ulong)local_2c0);
          trim(local_388);
          std::__cxx11::string::operator=((string *)&linenum,(string *)local_388);
          std::__cxx11::string::~string((string *)local_388);
          std::__cxx11::string::~string((string *)&nameEnd);
        }
        else {
          local_3b0 = std::__cxx11::string::find((char)local_2c0,0x3d);
          if (local_3b0 == -1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_3d8,"inifile",&local_3d9);
            debug(&local_3b1);
            pDVar4 = DebugStream::operator<<
                               ((DebugStream *)&local_3b1,"invalid file, missing = at line ");
            DebugStream::operator<<(pDVar4,commentStart);
            DebugStream::~DebugStream((DebugStream *)&local_3b1);
            std::__cxx11::string::~string(local_3d8);
            std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
            this_local._7_1_ = false;
            goto LAB_0013b39d;
          }
          std::__cxx11::string::substr((ulong)local_440,(ulong)local_2c0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_460,"%20",&local_461);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_488," ",&local_489);
          string_replace(local_420,local_440,(string *)local_460);
          trim(local_400);
          std::__cxx11::string::~string((string *)local_420);
          std::__cxx11::string::~string(local_488);
          std::allocator<char>::~allocator((allocator<char> *)&local_489);
          std::__cxx11::string::~string(local_460);
          std::allocator<char>::~allocator((allocator<char> *)&local_461);
          std::__cxx11::string::~string((string *)local_440);
          std::__cxx11::string::substr((ulong)local_4d0,(ulong)local_2c0);
          trim(local_4b0);
          std::__cxx11::string::~string(local_4d0);
          bVar2 = std::operator==(local_400,"");
          if ((!bVar2) && (bVar2 = std::operator==(local_4b0,""), !bVar2)) {
            this_00 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                      ::operator[](&this->m_values,(key_type *)&linenum);
            this_01 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](this_00,local_400);
            std::__cxx11::string::operator=((string *)this_01,(string *)local_4b0);
          }
          std::__cxx11::string::~string((string *)local_4b0);
          std::__cxx11::string::~string((string *)local_400);
        }
      }
    }
    this_local._7_1_ = true;
LAB_0013b39d:
    std::__cxx11::string::~string((string *)&linenum);
    std::__cxx11::string::~string(local_2c0);
  }
  std::ifstream::~ifstream(&exp_res.we_offs);
  return this_local._7_1_;
}

Assistant:

bool IniFile::readFile(std::string filename)
{
    std::ifstream file;
    wordexp_t exp_res;
    wordexp(filename.c_str(), &exp_res, 0);
    file.open(exp_res.we_wordv[0]);
    wordfree(&exp_res);

    if (!file.is_open()) {
        debug("inifile") << "unable to open file" << filename;
        return 1;
    }

    std::string line;
    std::string group;
    size_t linenum = 0;

    while (std::getline(file, line)) {
        linenum++;
        size_t commentStart = line.find("//");

        if (commentStart != std::string::npos) {
            line = trim(line.substr(0, commentStart));
        }

        if (line.length() == 0 || line.front() == '#') {
            continue;
        }

        if (line[0] == '[') {
            size_t end = line.find(']');

            if (end == std::string::npos) {
                debug("inifile") << "invalid file, unclosed group at line " << linenum;
                return false;
            }

            group = trim(line.substr(1, end - 1));
            continue;
        }

        size_t nameEnd = line.find('=');

        if (nameEnd == std::string::npos) {
            debug("inifile") << "invalid file, missing = at line " << linenum;
            return false;
        }

        std::string name = trim(string_replace(line.substr(0, nameEnd), "%20", " "));
        std::string value = trim(line.substr(nameEnd + 1));

        if (name == "" || value == "") {
            continue;
        }

        m_values[group][name] = value;
    }

    return true;
}